

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

Image * __thiscall nv::FloatImage::createImage(FloatImage *this,uint base_component,uint num)

{
  float *pfVar1;
  uint uVar2;
  uint8 auVar3 [4];
  AutoPtr<nv::Image> AVar4;
  int iVar5;
  Image *this_00;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar6;
  uint uVar7;
  ulong uVar8;
  uint idx;
  uint uVar9;
  uint uVar10;
  uint8 rgba [4];
  AutoPtr<nv::Image> img;
  
  if (4 < num) {
    iVar5 = nvAbort("num <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x5b,"Image *nv::FloatImage::createImage(uint, uint) const");
    if (iVar5 == 1) {
      raise(5);
    }
  }
  if (this->m_componentNum < num + base_component) {
    iVar5 = nvAbort("base_component + num <= m_componentNum",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x5c,"Image *nv::FloatImage::createImage(uint, uint) const");
    if (iVar5 == 1) {
      raise(5);
    }
  }
  this_00 = (Image *)operator_new(0x18);
  Image::Image(this_00);
  img.m_ptr = this_00;
  Image::allocate(this_00,(uint)this->m_width,(uint)this->m_height);
  uVar10 = base_component * this->m_width * (uint)this->m_height;
  uVar9 = (uint)this->m_height * (uint)this->m_width;
  for (idx = 0; AVar4.m_ptr = img.m_ptr, idx != uVar9; idx = idx + 1) {
    rgba[0] = '\0';
    rgba[1] = '\0';
    rgba[2] = '\0';
    rgba[3] = 0xff;
    pfVar1 = this->m_mem;
    uVar7 = uVar10;
    for (uVar8 = 0; auVar3 = rgba, num != uVar8; uVar8 = uVar8 + 1) {
      iVar5 = (int)(pfVar1[uVar7] * 255.0);
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      rgba[uVar8] = (uint8)iVar5;
      uVar7 = uVar7 + uVar9;
    }
    uVar2 = (uint)rgba >> 8;
    uVar7 = (uint)rgba >> 0x10;
    paVar6 = &Image::pixel(img.m_ptr,idx)->field_0;
    *paVar6 = (anon_union_4_2_12391d8d_for_Color32_0)
              (((uVar2 & 0xff) << 8 | ((uint)auVar3 & 0xff) << 0x10) + (uVar7 & 0xff) |
              (uint)auVar3 & 0xff000000);
    uVar10 = uVar10 + 1;
  }
  img.m_ptr = (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&img);
  return AVar4.m_ptr;
}

Assistant:

Image * FloatImage::createImage(uint base_component/*= 0*/, uint num/*= 4*/) const
{
	nvCheck(num <= 4);
	nvCheck(base_component + num <= m_componentNum);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++) {
		
		uint c;
		uint8 rgba[4]= {0, 0, 0, 0xff};

		for(c = 0; c < num; c++) {
			float f = m_mem[size * (base_component + c) + i];
			rgba[c] = nv::clamp(int(255.0f * f), 0, 255);
		}

		img->pixel(i) = Color32(rgba[0], rgba[1], rgba[2], rgba[3]);
	}
	
	return img.release();
}